

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O0

_Bool gravity_value_equals(gravity_value_t v1,gravity_value_t v2)

{
  _Bool _Var1;
  int iVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar4;
  gravity_class_t *pgVar5;
  bool local_b1;
  gravity_object_t *obj2;
  gravity_object_t *obj1;
  gravity_map_t *map2;
  gravity_map_t *map1;
  gravity_value_t value2;
  gravity_value_t value1;
  size_t i;
  size_t count;
  gravity_list_t *list2;
  gravity_list_t *list1;
  gravity_range_t *r2;
  gravity_range_t *r1;
  gravity_string_t *s2;
  gravity_string_t *s1;
  gravity_value_t v2_local;
  gravity_value_t v1_local;
  
  aVar3 = v2.field_1;
  aVar4 = v1.field_1;
  pgVar5 = v1.isa;
  if (pgVar5 == v2.isa) {
    if (((pgVar5 == gravity_class_int) || (pgVar5 == gravity_class_bool)) ||
       (pgVar5 == gravity_class_null)) {
      v1_local.field_1.n._7_1_ = aVar4.n == aVar3.n;
    }
    else if (pgVar5 == gravity_class_float) {
      v1_local.field_1.n._7_1_ = ABS(aVar4.f - aVar3.f) < 1e-06;
    }
    else if (pgVar5 == gravity_class_string) {
      if (*(int *)&(aVar4.p)->identifier == *(int *)&(aVar3.p)->identifier) {
        if (*(int *)((long)&(aVar4.p)->identifier + 4) == *(int *)((long)&(aVar3.p)->identifier + 4)
           ) {
          iVar2 = memcmp((aVar4.p)->objclass,(aVar3.p)->objclass,
                         (ulong)*(uint *)((long)&(aVar4.p)->identifier + 4));
          v1_local.field_1.n._7_1_ = iVar2 == 0;
        }
        else {
          v1_local.field_1.n._7_1_ = 0;
        }
      }
      else {
        v1_local.field_1.n._7_1_ = 0;
      }
    }
    else if (pgVar5 == gravity_class_range) {
      local_b1 = false;
      if ((aVar4.p)->objclass == (aVar3.p)->objclass) {
        local_b1 = (aVar4.p)->identifier == (aVar3.p)->identifier;
      }
      v1_local.field_1.n._7_1_ = local_b1;
    }
    else if (pgVar5 == gravity_class_list) {
      if ((aVar4.p)->objclass == (aVar3.p)->objclass) {
        pgVar5 = (aVar4.p)->objclass;
        for (value1.field_1.n = 0; value1.field_1.p < pgVar5;
            value1.field_1.p = (gravity_object_t *)((long)&(value1.field_1.p)->isa + 1)) {
          _Var1 = gravity_value_equals
                            (*(gravity_value_t *)
                              (*(long *)&(aVar4.p)->has_outer + value1.field_1.n * 0x10),
                             *(gravity_value_t *)
                              (*(long *)&(aVar3.p)->has_outer + value1.field_1.n * 0x10));
          if (!_Var1) {
            return false;
          }
        }
        v1_local.field_1.n._7_1_ = 1;
      }
      else {
        v1_local.field_1.n._7_1_ = 0;
      }
    }
    else if (pgVar5 == gravity_class_map) {
      v1_local.field_1.n._7_1_ =
           gravity_hash_compare
                     ((gravity_hash_t *)(aVar4.p)->objclass,(gravity_hash_t *)(aVar3.p)->objclass,
                      hash_value_compare_cb,(void *)0x0);
    }
    else if ((aVar4.p)->isa == (aVar3.p)->isa) {
      v1_local.field_1.n._7_1_ = aVar4.n == aVar3.n;
    }
    else {
      v1_local.field_1.n._7_1_ = 0;
    }
  }
  else {
    v1_local.field_1.n._7_1_ = 0;
  }
  return (_Bool)v1_local.field_1.n._7_1_;
}

Assistant:

bool gravity_value_equals (gravity_value_t v1, gravity_value_t v2) {

    // check same class
    if (v1.isa != v2.isa) return false;

    // check same value for value types
    if ((v1.isa == gravity_class_int) || (v1.isa == gravity_class_bool) || (v1.isa == gravity_class_null)) {
        return (v1.n == v2.n);
    } else if (v1.isa == gravity_class_float) {
        #if GRAVITY_ENABLE_DOUBLE
        return (fabs(v1.f - v2.f) < EPSILON);
        #else
        return (fabsf(v1.f - v2.f) < EPSILON);
        #endif
    } else if (v1.isa == gravity_class_string) {
        gravity_string_t *s1 = VALUE_AS_STRING(v1);
        gravity_string_t *s2 = VALUE_AS_STRING(v2);
        if (s1->hash != s2->hash) return false;
        if (s1->len != s2->len) return false;
        // same hash and same len so let's compare bytes
        return (memcmp(s1->s, s2->s, s1->len) == 0);
    } else if (v1.isa == gravity_class_range) {
        gravity_range_t *r1 = VALUE_AS_RANGE(v1);
        gravity_range_t *r2 = VALUE_AS_RANGE(v2);
        return ((r1->from == r2->from) && (r1->to == r2->to));
    } else if (v1.isa == gravity_class_list) {
        gravity_list_t *list1 = VALUE_AS_LIST(v1);
        gravity_list_t *list2 = VALUE_AS_LIST(v2);
        if (marray_size(list1->array) != marray_size(list2->array)) return false;
        size_t count = marray_size(list1->array);
        for (size_t i=0; i<count; ++i) {
            gravity_value_t value1 = marray_get(list1->array, i);
            gravity_value_t value2 = marray_get(list2->array, i);
            if (!gravity_value_equals(value1, value2)) return false;
        }
        return true;
    } else if (v1.isa == gravity_class_map) {
        gravity_map_t *map1 = VALUE_AS_MAP(v1);
        gravity_map_t *map2 = VALUE_AS_MAP(v2);
        return gravity_hash_compare(map1->hash, map2->hash, hash_value_compare_cb, NULL);
    }

    // if here means that they are two heap allocated objects
    gravity_object_t *obj1 = VALUE_AS_OBJECT(v1);
    gravity_object_t *obj2 = VALUE_AS_OBJECT(v2);
    if (obj1->isa != obj2->isa) return false;

    return (obj1 == obj2);
}